

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O1

void __thiscall
duckdb::UngroupedAggregateGlobalSinkState::UngroupedAggregateGlobalSinkState
          (UngroupedAggregateGlobalSinkState *this,PhysicalUngroupedAggregate *op,
          ClientContext *client)

{
  unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
  *this_00;
  _Tuple_impl<0UL,_duckdb::DistinctAggregateState_*,_std::default_delete<duckdb::DistinctAggregateState>_>
  __ptr_00;
  Allocator *client_allocator;
  type data;
  _Tuple_impl<0UL,_duckdb::DistinctAggregateState_*,_std::default_delete<duckdb::DistinctAggregateState>_>
  this_01;
  pointer *__ptr;
  pointer *__ptr_1;
  pointer __p;
  DistinctAggregateState *local_38;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__UngroupedAggregateGlobalSinkState_02499f30;
  client_allocator = BufferAllocator::Get(client);
  GlobalUngroupedAggregateState::GlobalUngroupedAggregateState
            (&this->state,client_allocator,&op->aggregates);
  this->finished = false;
  (this->distinct_state).
  super_unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctAggregateState_*,_std::default_delete<duckdb::DistinctAggregateState>_>
  .super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>._M_head_impl =
       (DistinctAggregateState *)0x0;
  if ((op->distinct_data).
      super_unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateData_*,_std::default_delete<duckdb::DistinctAggregateData>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateData_*,_false>._M_head_impl !=
      (DistinctAggregateData *)0x0) {
    this_00 = &this->distinct_state;
    data = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
           ::operator*(&op->distinct_data);
    this_01.super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>)operator_new(0x78);
    DistinctAggregateState::DistinctAggregateState
              ((DistinctAggregateState *)
               this_01.super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>._M_head_impl,
               data,client);
    local_38 = (DistinctAggregateState *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::DistinctAggregateState_*,_std::default_delete<duckdb::DistinctAggregateState>_>
         .super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>;
    (this_00->
    super_unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::DistinctAggregateState_*,_std::default_delete<duckdb::DistinctAggregateState>_>
    .super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>._M_head_impl !=
        (DistinctAggregateState *)0x0) {
      ::std::default_delete<duckdb::DistinctAggregateState>::operator()
                ((default_delete<duckdb::DistinctAggregateState> *)this_00,
                 (DistinctAggregateState *)
                 __ptr_00.super__Head_base<0UL,_duckdb::DistinctAggregateState_*,_false>.
                 _M_head_impl);
    }
    if (local_38 != (DistinctAggregateState *)0x0) {
      ::std::default_delete<duckdb::DistinctAggregateState>::operator()
                ((default_delete<duckdb::DistinctAggregateState> *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

UngroupedAggregateGlobalSinkState(const PhysicalUngroupedAggregate &op, ClientContext &client)
	    : state(BufferAllocator::Get(client), op.aggregates), finished(false) {
		if (op.distinct_data) {
			distinct_state = make_uniq<DistinctAggregateState>(*op.distinct_data, client);
		}
	}